

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int TestXmmRptrEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                       _func_int_uchar_ptr_x86XmmReg_x86Size_x86Reg_int_x86Reg_int *fun,
                       uint testSize)

{
  int iVar1;
  int iVar2;
  uint local_44;
  uint local_40;
  uint base;
  uint index;
  uint xmm;
  uchar *start;
  uint testSize_local;
  _func_int_uchar_ptr_x86XmmReg_x86Size_x86Reg_int_x86Reg_int *fun_local;
  uchar *puStack_18;
  x86Command op_local;
  uchar *stream_local;
  CodeGenGenericContext *ctx_local;
  
  puStack_18 = stream;
  for (base = 0; base < 6; base = base + 1) {
    for (local_40 = 0; local_40 < 9; local_40 = local_40 + 1) {
      for (local_44 = 0; local_44 < 10; local_44 = local_44 + 1) {
        if ((testSize & 1) != 0) {
          if ((testIndexRegs[local_44] != rNONE) || (testBaseRegs[local_44] != rNONE)) {
            EMIT_OP_REG_RPTR(ctx,op,testXmmRegs[base],sDWORD,testIndexRegs[local_40],1,
                             testBaseRegs[local_44],0);
            iVar1 = (*fun)(puStack_18,testXmmRegs[base],sDWORD,testIndexRegs[local_40],1,
                           testBaseRegs[local_44],0);
            puStack_18 = puStack_18 + iVar1;
            EMIT_OP_REG_RPTR(ctx,op,testXmmRegs[base],sDWORD,testIndexRegs[local_40],1,
                             testBaseRegs[local_44],4);
            iVar1 = (*fun)(puStack_18,testXmmRegs[base],sDWORD,testIndexRegs[local_40],1,
                           testBaseRegs[local_44],4);
            EMIT_OP_REG_RPTR(ctx,op,testXmmRegs[base],sDWORD,testIndexRegs[local_40],1,
                             testBaseRegs[local_44],0x400);
            iVar2 = (*fun)(puStack_18 + iVar1,testXmmRegs[base],sDWORD,testIndexRegs[local_40],1,
                           testBaseRegs[local_44],0x400);
            puStack_18 = puStack_18 + iVar1 + iVar2;
          }
          if (testIndexRegs[local_40] != rNONE) {
            EMIT_OP_REG_RPTR(ctx,op,testXmmRegs[base],sDWORD,testIndexRegs[local_40],2,
                             testBaseRegs[local_44],0);
            iVar1 = (*fun)(puStack_18,testXmmRegs[base],sDWORD,testIndexRegs[local_40],2,
                           testBaseRegs[local_44],0);
            puStack_18 = puStack_18 + iVar1;
            EMIT_OP_REG_RPTR(ctx,op,testXmmRegs[base],sDWORD,testIndexRegs[local_40],2,
                             testBaseRegs[local_44],4);
            iVar1 = (*fun)(puStack_18,testXmmRegs[base],sDWORD,testIndexRegs[local_40],2,
                           testBaseRegs[local_44],4);
            EMIT_OP_REG_RPTR(ctx,op,testXmmRegs[base],sDWORD,testIndexRegs[local_40],2,
                             testBaseRegs[local_44],0x400);
            iVar2 = (*fun)(puStack_18 + iVar1,testXmmRegs[base],sDWORD,testIndexRegs[local_40],2,
                           testBaseRegs[local_44],0x400);
            puStack_18 = puStack_18 + iVar1 + iVar2;
          }
        }
        if ((testSize & 2) != 0) {
          if ((testIndexRegs[local_44] != rNONE) || (testBaseRegs[local_44] != rNONE)) {
            EMIT_OP_REG_RPTR(ctx,op,testXmmRegs[base],sQWORD,testIndexRegs[local_40],1,
                             testBaseRegs[local_44],0);
            iVar1 = (*fun)(puStack_18,testXmmRegs[base],sQWORD,testIndexRegs[local_40],1,
                           testBaseRegs[local_44],0);
            puStack_18 = puStack_18 + iVar1;
            EMIT_OP_REG_RPTR(ctx,op,testXmmRegs[base],sQWORD,testIndexRegs[local_40],1,
                             testBaseRegs[local_44],4);
            iVar1 = (*fun)(puStack_18,testXmmRegs[base],sQWORD,testIndexRegs[local_40],1,
                           testBaseRegs[local_44],4);
            EMIT_OP_REG_RPTR(ctx,op,testXmmRegs[base],sQWORD,testIndexRegs[local_40],1,
                             testBaseRegs[local_44],0x400);
            iVar2 = (*fun)(puStack_18 + iVar1,testXmmRegs[base],sQWORD,testIndexRegs[local_40],1,
                           testBaseRegs[local_44],0x400);
            puStack_18 = puStack_18 + iVar1 + iVar2;
          }
          if (testIndexRegs[local_40] != rNONE) {
            EMIT_OP_REG_RPTR(ctx,op,testXmmRegs[base],sQWORD,testIndexRegs[local_40],2,
                             testBaseRegs[local_44],0);
            iVar1 = (*fun)(puStack_18,testXmmRegs[base],sQWORD,testIndexRegs[local_40],2,
                           testBaseRegs[local_44],0);
            puStack_18 = puStack_18 + iVar1;
            EMIT_OP_REG_RPTR(ctx,op,testXmmRegs[base],sQWORD,testIndexRegs[local_40],2,
                             testBaseRegs[local_44],4);
            iVar1 = (*fun)(puStack_18,testXmmRegs[base],sQWORD,testIndexRegs[local_40],2,
                           testBaseRegs[local_44],4);
            EMIT_OP_REG_RPTR(ctx,op,testXmmRegs[base],sQWORD,testIndexRegs[local_40],2,
                             testBaseRegs[local_44],0x400);
            iVar2 = (*fun)(puStack_18 + iVar1,testXmmRegs[base],sQWORD,testIndexRegs[local_40],2,
                           testBaseRegs[local_44],0x400);
            puStack_18 = puStack_18 + iVar1 + iVar2;
          }
        }
      }
    }
  }
  return (int)puStack_18 - (int)stream;
}

Assistant:

int TestXmmRptrEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86XmmReg dst, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift), unsigned testSize = testSizeDword | testSizeQword)
{
	unsigned char *start = stream;

	for(unsigned xmm = 0; xmm < sizeof(testXmmRegs) / sizeof(testXmmRegs[0]); xmm++)
	{
		for(unsigned index = 0; index < sizeof(testIndexRegs) / sizeof(testIndexRegs[0]); index++)
		{
			for(unsigned base = 0; base < sizeof(testBaseRegs) / sizeof(testBaseRegs[0]); base++)
			{
				if(testSize & testSizeDword)
				{
					if(testIndexRegs[base] != rNONE || testBaseRegs[base] != rNONE)
					{
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 0);
						stream += fun(stream, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 0);
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 4);
						stream += fun(stream, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 4);
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024);
						stream += fun(stream, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024);
					}

					if(testIndexRegs[index] != rNONE)
					{
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 0);
						stream += fun(stream, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 0);
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 4);
						stream += fun(stream, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 4);
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024);
						stream += fun(stream, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024);
					}
				}

				if(testSize & testSizeQword)
				{
					// skip RDI-based addressing
					if(testIndexRegs[base] != rNONE || testBaseRegs[base] != rNONE)
					{
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 0);
						stream += fun(stream, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 0);
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 4);
						stream += fun(stream, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 4);
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024);
						stream += fun(stream, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024);
					}

					if(testIndexRegs[index] != rNONE)
					{
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 0);
						stream += fun(stream, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 0);
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 4);
						stream += fun(stream, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 4);
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024);
						stream += fun(stream, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024);
					}
				}
			}
		}
	}

	return int(stream - start);
}